

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cni.hpp
# Opt level: O0

void __thiscall
cs_impl::cni_holder<char_(*)(),_char_(*)()>::cni_holder
          (cni_holder<char_(*)(),_char_(*)()> *this,_func_char **func)

{
  function<char_()> *in_RDI;
  cni_helper<char_(*)(),_char_(*)()> *this_00;
  function<char_()> *in_stack_ffffffffffffffc0;
  _func_char *local_30 [6];
  
  cni_holder_base::cni_holder_base((cni_holder_base *)in_RDI);
  *(undefined ***)&(in_RDI->super__Function_base)._M_functor = &PTR__cni_holder_003e57c8;
  this_00 = (cni_helper<char_(*)(),_char_(*)()> *)
            ((long)&(in_RDI->super__Function_base)._M_functor + 8);
  std::function<char()>::function<char(*const&)(),void>(in_stack_ffffffffffffffc0,local_30);
  cni_helper<char_(*)(),_char_(*)()>::cni_helper(this_00,in_RDI);
  std::function<char_()>::~function((function<char_()> *)0x2fcbe6);
  return;
}

Assistant:

explicit cni_holder(const T &func) : mCni(func) {}